

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkStrash.c
# Opt level: O2

Aig_Man_t * Nwk_ManStrash(Nwk_Man_t *pNtk)

{
  int iVar1;
  uint uVar2;
  Aig_Man_t *p;
  char *pcVar3;
  Tim_Man_t *p_00;
  void *pvVar4;
  Vec_Ptr_t *p_01;
  Nwk_Obj_t *pObj;
  Aig_Obj_t *pAVar5;
  float fVar6;
  
  iVar1 = Nwk_ManGetAigNodeNum(pNtk);
  p = Aig_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(pNtk->pName);
  p->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(pNtk->pSpec);
  p->pSpec = pcVar3;
  p_00 = Tim_ManDup(pNtk->pManTime,1);
  p->pManTime = p_00;
  Tim_ManIncrementTravId(p_00);
  for (iVar1 = 0; iVar1 < pNtk->vObjs->nSize; iVar1 = iVar1 + 1) {
    pvVar4 = Vec_PtrEntry(pNtk->vObjs,iVar1);
    if (pvVar4 != (void *)0x0) {
      *(undefined8 *)((long)pvVar4 + 0x10) = 0;
    }
  }
  p_01 = Nwk_ManDfs(pNtk);
  iVar1 = 0;
  do {
    if (p_01->nSize <= iVar1) {
      free(p_01->pArray);
      free(p_01);
      Aig_ManCleanup(p);
      Aig_ManSetRegNum(p,0);
      return p;
    }
    pObj = (Nwk_Obj_t *)Vec_PtrEntry(p_01,iVar1);
    uVar2 = *(uint *)&pObj->field_0x20 & 7;
    if (uVar2 == 3) {
      pAVar5 = Nwk_ManStrashNode(p,pObj);
    }
    else if (uVar2 == 2) {
      pAVar5 = Aig_ObjCreateCo(p,(Aig_Obj_t *)
                                 ((ulong)(*(uint *)&pObj->field_0x20 >> 3 & 1) ^
                                 (ulong)(*pObj->pFanio)->pCopy));
      if (((ulong)pAVar5 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x143,"int Aig_ObjLevel(Aig_Obj_t *)");
      }
      Tim_ManSetCoArrival((Tim_Man_t *)p->pManTime,*(uint *)&pObj->field_0x20 >> 7,
                          (float)(*(uint *)&pAVar5->field_0x1c & 0xffffff));
    }
    else {
      if (uVar2 != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkStrash.c"
                      ,0x86,"Aig_Man_t *Nwk_ManStrash(Nwk_Man_t *)");
      }
      pAVar5 = Aig_ObjCreateCi(p);
      fVar6 = Tim_ManGetCiArrival((Tim_Man_t *)p->pManTime,*(uint *)&pObj->field_0x20 >> 7);
      if (((ulong)pAVar5 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x145,"int Aig_ObjSetLevel(Aig_Obj_t *, int)");
      }
      *(ulong *)&pAVar5->field_0x18 =
           *(ulong *)&pAVar5->field_0x18 & 0xff000000ffffffff |
           (ulong)((int)fVar6 & 0xffffff) << 0x20;
    }
    pObj->pCopy = pAVar5;
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Nwk_ManStrash( Nwk_Man_t * pNtk )
{
    Vec_Ptr_t * vObjs;
    Aig_Man_t * pMan;
    Aig_Obj_t * pObjNew = NULL;
    Nwk_Obj_t * pObj;
    int i, Level;
    pMan = Aig_ManStart( Nwk_ManGetAigNodeNum(pNtk) );
    pMan->pName = Abc_UtilStrsav( pNtk->pName );
    pMan->pSpec = Abc_UtilStrsav( pNtk->pSpec );
    pMan->pManTime = Tim_ManDup( (Tim_Man_t *)pNtk->pManTime, 1 );
    Tim_ManIncrementTravId( (Tim_Man_t *)pMan->pManTime );
    Nwk_ManForEachObj( pNtk, pObj, i )
        pObj->pCopy = NULL;
//    Nwk_ManForEachObj( pNtk, pObj, i )
    vObjs = Nwk_ManDfs( pNtk );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vObjs, pObj, i )
    {
        if ( Nwk_ObjIsCi(pObj) )
        {
            pObjNew = Aig_ObjCreateCi(pMan);
            Level = Tim_ManGetCiArrival( (Tim_Man_t *)pMan->pManTime, pObj->PioId );
            Aig_ObjSetLevel( pObjNew, Level );
        }
        else if ( Nwk_ObjIsCo(pObj) )
        {
            pObjNew = Aig_ObjCreateCo( pMan, Aig_NotCond((Aig_Obj_t *)Nwk_ObjFanin0(pObj)->pCopy, pObj->fInvert) );
            Level = Aig_ObjLevel( pObjNew );
            Tim_ManSetCoArrival( (Tim_Man_t *)pMan->pManTime, pObj->PioId, (float)Level );
        }
        else if ( Nwk_ObjIsNode(pObj) )
        {
            pObjNew = Nwk_ManStrashNode( pMan, pObj );
        }
        else
            assert( 0 );
        pObj->pCopy = pObjNew;
    }
    Vec_PtrFree( vObjs );
    Aig_ManCleanup( pMan );
    Aig_ManSetRegNum( pMan, 0 );
    return pMan;
}